

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_listener.hpp
# Opt level: O0

TestEventListener * __thiscall
iutest::TestEventListeners::Release(TestEventListeners *this,TestEventListener *listener)

{
  TestEventListener *pTVar1;
  TestEventListener *listener_local;
  TestEventListeners *this_local;
  
  if (listener == this->m_default_result_printer) {
    this->m_default_result_printer = (TestEventListener *)0x0;
  }
  if (listener == this->m_default_xml_generator) {
    this->m_default_xml_generator = (TestEventListener *)0x0;
  }
  pTVar1 = TestEventRepeater::Release(&this->m_repeater,listener);
  return pTVar1;
}

Assistant:

TestEventListener* Release(TestEventListener* listener)
    {
        if( listener == m_default_result_printer )
        {
            m_default_result_printer = NULL;
        }
        if( listener == m_default_xml_generator )
        {
            m_default_xml_generator = NULL;
        }
        return m_repeater.Release(listener);
    }